

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_NetworkIdentifyWithDomain_Test::TestBody
          (InterpreterTestSuite_PC_NetworkIdentifyWithDomain_Test *this)

{
  Registry *pRVar1;
  Status SVar2;
  reference this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *expected_predicate_value;
  char *pcVar3;
  Status local_51a;
  allocator local_519;
  allocator local_518;
  allocator local_517;
  allocator local_516;
  allocator local_515;
  allocator local_514;
  allocator local_513;
  allocator local_512;
  Status local_511;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_1;
  Value local_4c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_478;
  Json json;
  State local_438;
  State local_434;
  Value value;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  string local_3c8;
  Network nwk;
  Expression expr;
  UnixTime local_328;
  UnixTime local_320;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_318;
  _Any_data local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  nwk.mId.mId = 0;
  nwk.mDomainId.mId = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&nwk);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&nwk);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x620,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    this_01 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&br.mId;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&br.mId);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&nwk,"127.0.0.1",&local_512);
    local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&value,"1.1",&local_513);
    ot::commissioner::BorderAgent::State::State(&local_434,0,0,0,0,0);
    std::__cxx11::string::string((string *)&local_4c0,"net1",&local_514);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_515);
    std::__cxx11::string::string((string *)&expr,"",&local_516);
    std::__cxx11::string::string((string *)&json,"",&local_517);
    local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&gtest_ar_6,"domain1",&local_518);
    pcVar3 = "";
    std::__cxx11::string::string((string *)&local_3c8,"",&local_519);
    ot::commissioner::UnixTime::UnixTime(&local_320,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&nwk,0x4e21,(ByteArray *)&local_478,(string *)&value,
               local_434,(string *)&local_4c0,1,(string *)&gtest_ar_,(string *)&expr,(Timestamp)0x0,
               0,(string *)&json,(ByteArray *)&local_3e8,(string *)&gtest_ar_6,'\0',0,&local_3c8,
               local_320,0x103f);
    local_511 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
    local_51a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_511,&local_51a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
    std::__cxx11::string::~string((string *)&json);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
    std::__cxx11::string::~string((string *)&nwk);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x624,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_01 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&nwk,"127.0.0.2",&local_512);
      local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&value,"1.1",&local_513);
      ot::commissioner::BorderAgent::State::State(&local_438,0,0,0,0,0);
      std::__cxx11::string::string((string *)&local_4c0,"net2",&local_514);
      std::__cxx11::string::string((string *)&gtest_ar_,"",&local_515);
      std::__cxx11::string::string((string *)&expr,"",&local_516);
      std::__cxx11::string::string((string *)&json,"",&local_517);
      local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&gtest_ar_6,"",&local_518);
      pcVar3 = "";
      std::__cxx11::string::string((string *)&local_3c8,"",&local_519);
      ot::commissioner::UnixTime::UnixTime(&local_328,0);
      expected_predicate_value = (char *)(ulong)(uint)local_438;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&nwk,0x4e22,(ByteArray *)&local_478,(string *)&value,
                 local_438,(string *)&local_4c0,2,(string *)&gtest_ar_,(string *)&expr,
                 (Timestamp)0x0,0,(string *)&json,(ByteArray *)&local_3e8,(string *)&gtest_ar_6,'\0'
                 ,0,&local_3c8,local_328,0x3f);
      local_511 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
      local_51a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x3F})"
                 ,"RegistryStatus::kSuccess",&local_511,&local_51a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&gtest_ar_6);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
      std::__cxx11::string::~string((string *)&json);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&value);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
      std::__cxx11::string::~string((string *)&nwk);
      if (gtest_ar_1.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
        ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk.mId,0);
        br.mNetworkId = nwk.mId;
        SVar2 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br)
        ;
        value.mError.mCode = CONCAT31(value.mError.mCode._1_3_,SVar2);
        local_4c0.mError.mCode = local_4c0.mError.mCode & 0xffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwk,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",(Status *)&value,(Status *)&local_4c0);
        if ((char)nwk.mId.mId == '\0') {
          testing::Message::Message((Message *)&value);
          if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)nwk.mName._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x62b,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c0,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c0);
          if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
          ot::commissioner::persistent_storage::Network::Network(&nwk);
          SVar2 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                            (ctx.mRegistry,&nwk);
          local_4c0.mError.mCode = CONCAT31(local_4c0.mError.mCode._1_3_,SVar2);
          gtest_ar_.success_ = false;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",(Status *)&local_4c0,&gtest_ar_.success_);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&local_4c0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x62e,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&local_4c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if ((long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          local_4c0.mError.mCode = kNone;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&value,"nwk.mId.mId","0",(uint *)&nwk,(int *)&local_4c0);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&local_4c0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x62f,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&local_4c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if ((long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          value.mError.mCode = kNone;
          value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&local_4c0,"Network identify",(allocator *)&json);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&local_4c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&local_4c0);
          ot::commissioner::Interpreter::Eval(&local_4c0,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,&local_4c0);
          ot::commissioner::Interpreter::Value::~Value(&local_4c0);
          gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&json);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_4c0,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x636,(char *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode));
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&json)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
            std::__cxx11::string::~string((string *)&local_4c0);
            if (json._0_8_ != 0) {
              (**(code **)(*(long *)json._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json(&json,(nullptr_t)0x0);
          ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&local_4c0,&value);
          nlohmann::detail::input_adapter::
          input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((input_adapter *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c0
                    );
          local_2f8 = 0;
          uStack_2f0 = 0;
          local_308._M_unused._M_object = (void *)0x0;
          local_308._8_8_ = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::parse(&local_318,(input_adapter *)&gtest_ar_,(parser_callback_t *)&local_308,true);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(&json,&local_318);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_318);
          std::_Function_base::~_Function_base((_Function_base *)&local_308);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
          std::__cxx11::string::~string((string *)&local_4c0);
          gtest_ar_.success_ =
               nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&gtest_ar_6);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_4c0,(internal *)&gtest_ar_,
                       (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true",
                       expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_3c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x640,(char *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_3c8,(Message *)&gtest_ar_6);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_4c0);
            if ((long *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::__cxx11::string::string
                    ((string *)&gtest_ar_,"0x0000000000000001",(allocator *)&local_3c8);
          this_00 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::at(&json,(key_type *)&gtest_ar_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c0
                     ,this_00);
          testing::internal::CmpHelperSTREQ
                    ((internal *)&gtest_ar_6,"\"domain1/net1\"",
                     "json.at(\"0x0000000000000001\").get<std::string>().c_str()","domain1/net1",
                     (char *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode));
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (gtest_ar_6.success_ == false) {
            testing::Message::Message((Message *)&local_4c0);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_6.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x641,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)&local_4c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if ((long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4c0.mError._4_4_,local_4c0.mError.mCode) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_6.message_);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&json);
          ot::commissioner::Interpreter::Value::~Value(&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&expr);
          ot::commissioner::persistent_storage::Network::~Network(&nwk);
        }
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
        goto LAB_00161f54;
      }
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x628,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_01 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_00161f54:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkIdentifyWithDomain)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0,
                                             0x3F}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network identify");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    Json json;
    try
    {
        json = Json::parse(value.ToString());
    } catch (Json::parse_error &e)
    {
        EXPECT_TRUE(false) << "Failed to parse value: " << e.what();
    }
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_STREQ("domain1/net1", json.at("0x0000000000000001").get<std::string>().c_str());
}